

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_> * __thiscall
kj::_::NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_>::operator=
          (NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_> *this,
          NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_> *other)

{
  Promise<kj::HttpServer::Connection::LoopResult> *params;
  NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_> *other_local;
  NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::Promise<kj::HttpServer::Connection::LoopResult>>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<kj::Promise<kj::HttpServer::Connection::LoopResult>>(&(other->field_1).value);
      ctor<kj::Promise<kj::HttpServer::Connection::LoopResult>,kj::Promise<kj::HttpServer::Connection::LoopResult>>
                (&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }